

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Get_proc_index(int g_a,int iproc,int *index)

{
  Integer IVar1;
  long in_RDX;
  int in_EDI;
  int i;
  Integer _ga_work [7];
  Integer ndim;
  Integer proc;
  Integer aa;
  int local_6c;
  undefined8 local_68 [5];
  Integer *in_stack_ffffffffffffffc0;
  Integer in_stack_ffffffffffffffc8;
  Integer in_stack_ffffffffffffffd0;
  
  IVar1 = pnga_get_dimension((long)in_EDI);
  pnga_get_proc_index(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  for (local_6c = 0; local_6c < IVar1; local_6c = local_6c + 1) {
    *(int *)(in_RDX + ((IVar1 - local_6c) + -1) * 4) = (int)local_68[local_6c];
  }
  return;
}

Assistant:

void NGA_Get_proc_index(int g_a, int iproc, int index[])
{
     Integer aa, proc, ndim;
     Integer _ga_work[MAXDIM];
     aa = (Integer)g_a;
     proc = (Integer)iproc;
     ndim = wnga_get_dimension(aa);
     wnga_get_proc_index(aa, proc, _ga_work);
     COPYF2C(_ga_work,index, ndim);
}